

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

int picnic_impl_verify(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t siglen)

{
  uchar *buffer2;
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [64];
  uint r;
  int iVar20;
  ulong uVar21;
  sig_proof_t *prf;
  uint8_t *puVar22;
  uint64_t uVar23;
  zkbpp_lowmc_verify_implementation_f p_Var24;
  view_t *views;
  view_t *views_00;
  ulong *__ptr;
  uchar *buffer3;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  sig_proof_t *psVar30;
  ulong uVar31;
  byte *pbVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  byte bVar36;
  uint16_t uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  uint j_1;
  uint uVar41;
  proof_round_t *prf_round;
  proof_round_t *ppVar42;
  uint8_t **ppuVar43;
  sig_proof_t *psVar44;
  uint uVar45;
  byte bVar46;
  uint i_2;
  uint j;
  kdf_shake_x4_t *kdf;
  sig_proof_t *psVar47;
  uint8_t *puVar48;
  uint8_t **ppuVar49;
  long lVar50;
  uint j_4;
  ulong uVar51;
  uint8_t *src;
  mzd_local_t (*pamVar52) [1];
  hash_context *ctx;
  bool bVar53;
  in_out_shares_t in_out_shares;
  uint8_t *seeds [4];
  uchar challenge [438];
  uint local_9a8;
  ulong *local_990;
  sig_proof_t *local_968;
  uint local_94c;
  mzd_local_t local_8a0;
  mzd_local_t local_880;
  mzd_local_t local_860;
  hash_context local_840;
  ulong local_740 [8];
  undefined1 local_700 [128];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 auStack_5c0 [54];
  uchar local_58a [10];
  undefined1 auStack_580 [54];
  hash_context_x4 local_3c8;
  
  bVar1 = pp->digest_size;
  bVar36 = pp->input_output_size;
  uVar35 = (ulong)bVar36;
  bVar2 = pp->view_size;
  uVar8 = pp->num_rounds;
  uVar21 = (ulong)uVar8;
  lVar50 = uVar21 * 0x90;
  prf = (sig_proof_t *)calloc(1,lVar50 + 0x28);
  if (prf != (sig_proof_t *)0x0) {
    uVar26 = (uint)bVar2 + (uint)bVar36 * 2;
    uVar51 = 0;
    uVar41 = bVar2 + 7 & 0xfffffff8;
    _Var3 = context->unruh;
    uVar27 = 0;
    if (_Var3 != false) {
      uVar27 = uVar26;
    }
    local_9a8 = (uint)bVar1;
    uVar31 = (ulong)(uVar8 + 7 & 0xfffffff8);
    puVar22 = (uint8_t *)
              calloc(1,((uint)bVar36 + (uint)bVar36 * 4 + uVar41 + (uVar27 + local_9a8) * 2) *
                       (uint)uVar8 + uVar31);
    auVar19 = local_700._0_64_;
    puVar48 = puVar22 + uVar31;
    prf->challenge = puVar22;
    local_968 = prf + 1;
    puVar22 = prf[1].salt + 0x18;
    for (; uVar51 != uVar21; uVar51 = uVar51 + 1) {
      for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
        *(uint8_t **)(puVar22 + lVar29 * 8) = puVar48;
        puVar48 = puVar48 + bVar1;
      }
      puVar22 = puVar22 + 0x90;
    }
    for (lVar29 = 0; lVar50 - lVar29 != 0; lVar29 = lVar29 + 0x90) {
      *(uint8_t **)(prf[2].salt + lVar29 + 0x20) = puVar48;
      puVar48 = puVar48 + uVar41;
    }
    for (lVar29 = 0; lVar50 - lVar29 != 0; lVar29 = lVar29 + 0x90) {
      *(uint8_t **)(prf[3].salt + lVar29 + 0x10) = puVar48;
      puVar22 = puVar48 + (uint)bVar36 * 2;
      *(uint8_t **)(prf[3].salt + lVar29 + 0x18) = puVar48 + uVar35;
      puVar48 = puVar48 + uVar35 + uVar35 * 2;
      *(uint8_t **)(prf[3].salt + lVar29 + 0x20) = puVar22;
    }
    if (_Var3 != false) {
      psVar30 = prf + 4;
      for (uVar51 = 0; uVar51 != uVar21; uVar51 = uVar51 + 1) {
        for (lVar50 = 0; lVar50 != 2; lVar50 = lVar50 + 1) {
          *(uint8_t **)(psVar30->salt + lVar50 * 8) = puVar48;
          puVar48 = puVar48 + uVar26;
        }
        psVar30 = (sig_proof_t *)(psVar30[3].salt + 0x18);
      }
    }
    uVar51 = (ulong)((uint)uVar8 * 2 + 7 >> 3);
    uVar31 = siglen - uVar51;
    if (uVar51 <= siglen) {
      bVar4 = (pp->lowmc).m;
      bVar5 = (pp->lowmc).r;
      bVar6 = pp->seed_size;
      uVar9 = (pp->lowmc).n;
      local_700._0_8_ = sig;
      pbVar32 = prf->challenge;
      for (uVar51 = 0; (uint)uVar8 * 2 != uVar51; uVar51 = uVar51 + 2) {
        bVar46 = (byte)uVar51 & 6;
        bVar46 = (~(byte)(-1 << ((byte)(8 - bVar46) & 0x1f)) & sig[uVar51 >> 3]) >> (bVar46 ^ 6);
        if (bVar46 == 3) goto LAB_0011580e;
        *pbVar32 = bVar46 >> 1 | bVar46 * '\x02' & 2;
        pbVar32 = pbVar32 + 1;
      }
      local_700._16_48_ = auVar19._16_48_;
      local_700._8_8_ = uVar51;
      uVar23 = bitstream_get_bits((bitstream_t *)local_700,8 - ((uint)uVar51 & 6));
      uVar27 = (uint)((ulong)local_700._8_8_ >> 3);
      if (uVar23 != 0) {
        uVar27 = 0;
      }
      if ((uVar27 != 0) && (0x1f < uVar31)) {
        puVar22 = sig + (ulong)uVar27 + 0x20;
        uVar31 = uVar31 - 0x20;
        uVar13 = *(undefined8 *)(puVar22 + -0x18);
        uVar14 = *(undefined8 *)(puVar22 + -0x10);
        uVar15 = *(undefined8 *)(puVar22 + -8);
        *(undefined8 *)prf->salt = *(undefined8 *)(puVar22 + -0x20);
        *(undefined8 *)(prf->salt + 8) = uVar13;
        *(undefined8 *)(prf->salt + 0x10) = uVar14;
        *(undefined8 *)(prf->salt + 0x18) = uVar15;
        uVar27 = ~(0xff << ((uint)bVar36 * 8 - (uint)uVar9 & 0x1f));
        psVar30 = local_968;
        for (uVar51 = 0; uVar21 != uVar51; uVar51 = uVar51 + 1) {
          uVar41 = (uint)bVar36;
          uVar7 = prf->challenge[uVar51];
          uVar26 = 0;
          if (uVar7 == '\0') {
            uVar26 = uVar41;
          }
          _Var3 = context->unruh;
          if (uVar7 == '\0') {
            uVar41 = 0;
          }
          uVar26 = uVar26 + (uint)bVar2 + (uint)bVar36;
          uVar28 = 0;
          if (_Var3 != false) {
            uVar28 = uVar26;
          }
          uVar25 = (ulong)(uVar28 + uVar41 + (uint)bVar1 + (uint)bVar2 + (uint)bVar6 * 2);
          bVar53 = uVar31 < uVar25;
          uVar31 = uVar31 - uVar25;
          if (bVar53) goto LAB_0011580e;
          *(uint8_t **)psVar30[1].salt = puVar22;
          puVar22 = puVar22 + bVar1;
          if (_Var3 != false) {
            *(uint8_t **)(psVar30[3].salt + 0x10) = puVar22;
            puVar22 = puVar22 + uVar26;
          }
          *(uint8_t **)psVar30[2].salt = puVar22;
          if (((uint)puVar22[bVar2 - 1] &
              ~(0xff << ((uint)bVar5 * (uint)bVar4 * -3 + (uint)bVar2 * 8 & 0x1f))) != 0)
          goto LAB_0011580e;
          puVar22 = puVar22 + bVar2;
          *(uint8_t **)psVar30->salt = puVar22;
          *(uint8_t **)(psVar30->salt + 8) = puVar22 + bVar6;
          puVar22 = puVar22 + bVar6 + bVar6;
          if (uVar7 == '\x01') {
            *(uint8_t **)(psVar30[1].salt + 8) = puVar48;
            *(uint8_t **)(psVar30[1].salt + 0x10) = puVar22;
            if ((uVar27 & puVar22[bVar36 - 1]) != 0) goto LAB_0011580e;
            puVar22 = puVar22 + uVar35;
          }
          else {
            if (uVar7 == '\0') {
              *(uint8_t **)(psVar30[1].salt + 8) = puVar48;
              puVar48 = puVar48 + uVar35;
            }
            else {
              *(uint8_t **)(psVar30[1].salt + 8) = puVar22;
              if ((uVar27 & puVar22[bVar36 - 1]) != 0) goto LAB_0011580e;
              puVar22 = puVar22 + uVar35;
            }
            *(uint8_t **)(psVar30[1].salt + 0x10) = puVar48;
          }
          puVar48 = puVar48 + uVar35;
          psVar30 = (sig_proof_t *)(psVar30[3].salt + 0x18);
        }
        if (uVar31 == 0) {
          uVar8 = pp->num_rounds;
          bVar1 = pp->input_output_size;
          uVar31 = (ulong)bVar1;
          uVar9 = (pp->lowmc).n;
          uVar35 = (ulong)pp->view_size;
          uVar41 = (uint)(uVar35 + 7) & 0xfffffff8;
          p_Var24 = get_zkbpp_lowmc_verify_implementation(&pp->lowmc);
          lVar50 = (ulong)(pp->lowmc).r * 0x60;
          views = (view_t *)aligned_alloc(0x20,lVar50);
          views_00 = (view_t *)aligned_alloc(0x20,lVar50);
          __ptr = (ulong *)malloc((ulong)((uint)uVar8 * 2));
          puVar22 = (uint8_t *)aligned_alloc(8);
          uVar51 = (ulong)(bVar1 - 1);
          uVar21 = uVar35 + 7 >> 3;
          buffer2 = local_840.sponge.state + 0x80;
          buffer3 = local_840.sponge.state + 0xc0;
          iVar20 = (int)uVar21;
          uVar26 = iVar20 << 5;
          uVar27 = 0;
          while (uVar28 = uVar27, uVar28 != 3) {
            local_94c = 0;
            for (uVar25 = 0; uVar8 != uVar25; uVar25 = uVar25 + 1) {
              if (uVar28 == prf->challenge[uVar25]) {
                uVar33 = (ulong)local_94c;
                local_94c = local_94c + 1;
                *(ushort *)((long)__ptr + uVar33 * 2) = (ushort)uVar25;
              }
            }
            uVar45 = 0;
            uVar38 = (uVar28 + 1) % 3;
            uVar39 = (uVar28 + 2) % 3;
            local_990 = __ptr;
            while( true ) {
              bVar36 = (byte)(0xff << ((uint)bVar1 * 8 - (uint)uVar9 & 0x1f));
              if ((local_94c & 0xfffffffc) <= uVar45) break;
              kdf = (kdf_shake_x4_t *)local_700;
              local_740[0] = *local_990;
              uVar33 = local_740[0] & 0xffff;
              uVar40 = local_740[0] >> 0x30;
              uVar34 = local_740[0] >> 0x20 & 0xffff;
              uVar25 = local_740[0] >> 0x10 & 0xffff;
              for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 8) {
                local_840.sponge.state._8_8_ =
                     *(undefined8 *)((long)local_968 + lVar50 + uVar25 * 0x90);
                local_840.sponge.state._16_8_ =
                     *(undefined8 *)((long)local_968 + lVar50 + uVar34 * 0x90);
                uVar37 = (uint16_t)uVar38;
                if (lVar50 == 0) {
                  uVar37 = (uint16_t)uVar28;
                }
                local_840.sponge.state._0_8_ =
                     *(undefined8 *)((long)local_968 + lVar50 + uVar33 * 0x90);
                local_840.sponge.state._24_8_ =
                     *(undefined8 *)((long)local_968 + lVar50 + uVar40 * 0x90);
                kdf_init_x4_from_seed
                          (kdf,(uint8_t **)&local_840,(uint8_t *)prf,(uint16_t *)local_740,uVar37,
                           lVar50 == 0 && uVar38 != 0 || lVar50 == 8 && uVar39 != 0,pp);
                kdf = kdf + 1;
              }
              if (uVar38 != 0) {
                hash_squeeze_x4_4((hash_context_x4 *)local_700,
                                  *(uint8_t **)((long)local_968 + uVar33 * 0x90 + 0x30),
                                  *(uint8_t **)((long)local_968 + uVar25 * 0x90 + 0x30),
                                  *(uint8_t **)((long)local_968 + uVar34 * 0x90 + 0x30),
                                  *(uint8_t **)((long)local_968 + uVar40 * 0x90 + 0x30),uVar31);
              }
              if (uVar39 != 0) {
                hash_squeeze_x4_4(&local_3c8,*(uint8_t **)((long)local_968 + uVar33 * 0x90 + 0x38),
                                  *(uint8_t **)((long)local_968 + uVar25 * 0x90 + 0x38),
                                  *(uint8_t **)((long)local_968 + uVar34 * 0x90 + 0x38),
                                  *(uint8_t **)((long)local_968 + uVar40 * 0x90 + 0x38),uVar31);
              }
              puVar48 = puVar22;
              for (lVar50 = 0; lVar50 != 0x670; lVar50 = lVar50 + 0x338) {
                hash_squeeze_x4_4((hash_context_x4 *)(local_700 + lVar50),puVar48,puVar48 + uVar41,
                                  puVar48 + (uint)(iVar20 << 4),puVar48 + uVar21 * 0x18,uVar35);
                puVar48 = puVar48 + uVar26;
              }
              puVar48 = puVar22;
              for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
                uVar10 = *(ushort *)((long)local_990 + lVar50 * 2);
                if (uVar38 != 0) {
                  pbVar32 = (byte *)(*(long *)((long)local_968 + (ulong)uVar10 * 0x90 + 0x30) +
                                    uVar51);
                  *pbVar32 = *pbVar32 & bVar36;
                }
                mzd_from_char_array(&local_8a0,
                                    *(uint8_t **)((long)local_968 + (ulong)uVar10 * 0x90 + 0x30),
                                    uVar31);
                if (uVar39 != 0) {
                  pbVar32 = (byte *)(*(long *)((long)local_968 + (ulong)uVar10 * 0x90 + 0x38) +
                                    uVar51);
                  *pbVar32 = *pbVar32 & bVar36;
                }
                mzd_from_char_array(&local_880,
                                    *(uint8_t **)((long)local_968 + (ulong)uVar10 * 0x90 + 0x38),
                                    uVar31);
                src = puVar48;
                for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
                  decompress_view(views_00,pp,src,(uint)lVar29);
                  src = src + uVar26;
                }
                decompress_view(views,pp,*(uint8_t **)
                                          ((long)local_968 + (ulong)uVar10 * 0x90 + 0x50),1);
                pamVar52 = (mzd_local_t (*) [1])&local_8a0;
                (*p_Var24)(context->m_plaintext,views,(in_out_shares_t *)pamVar52,views_00,uVar28);
                compress_view(*(uint8_t **)((long)local_968 + (ulong)uVar10 * 0x90 + 0x48),pp,views,
                              0);
                mzd_share(&pp->lowmc,&local_860,(mzd_local_t *)pamVar52,&local_880,context->m_key);
                for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
                  mzd_to_char_array(*(uint8_t **)
                                     ((long)local_968 + lVar29 * 8 + (ulong)uVar10 * 0x90 + 0x60),
                                    *pamVar52,uVar31);
                  pamVar52 = pamVar52 + 1;
                }
                mzd_to_char_array(*(uint8_t **)((long)local_968 + (ulong)uVar10 * 0x90 + 0x70),
                                  &local_860,uVar31);
                puVar48 = puVar48 + uVar41;
              }
              for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 8) {
                uVar33 = (ulong)pp->digest_size;
                uVar10 = *(ushort *)((long)local_990 + 4);
                uVar25 = *local_990;
                uVar11 = *(ushort *)((long)local_990 + 2);
                uVar12 = *(ushort *)((long)local_990 + 6);
                hash_init_prefix_x4((hash_context_x4 *)local_700,uVar33,'\x04');
                lVar29 = (ulong)(ushort)uVar25 * 0x90 + 0x58;
                lVar16 = (ulong)uVar11 * 0x90 + 0x58;
                lVar17 = (ulong)uVar12 * 0x90 + 0x58;
                lVar18 = (ulong)uVar10 * 0x90 + 0x58;
                hash_update_x4_4((hash_context_x4 *)local_700,
                                 *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar29),
                                 *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar16),
                                 *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar18),
                                 *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar17),
                                 (ulong)pp->seed_size);
                hash_final_x4((hash_context_x4 *)local_700);
                hash_squeeze_x4_4((hash_context_x4 *)local_700,(uint8_t *)&local_840,
                                  local_840.sponge.state + 0x40,buffer2,buffer3,uVar33);
                hash_init_prefix_x4((hash_context_x4 *)local_700,uVar33,'\0');
                hash_update_x4_4((hash_context_x4 *)local_700,(uint8_t *)&local_840,
                                 local_840.sponge.state + 0x40,buffer2,buffer3,uVar33);
                hash_update_x4_4((hash_context_x4 *)local_700,
                                 *(uint8_t **)((long)prf + lVar50 + lVar29),
                                 *(uint8_t **)((long)prf + lVar50 + lVar16),
                                 *(uint8_t **)((long)prf + lVar50 + lVar18),
                                 *(uint8_t **)((long)prf + lVar50 + lVar17),
                                 (ulong)pp->input_output_size);
                hash_update_x4_4((hash_context_x4 *)local_700,
                                 *(uint8_t **)((long)prf + lVar50 + 0x18 + lVar29),
                                 *(uint8_t **)((long)prf + lVar50 + 0x18 + lVar16),
                                 *(uint8_t **)((long)prf + lVar50 + 0x18 + lVar18),
                                 *(uint8_t **)((long)prf + lVar50 + 0x18 + lVar17),
                                 (ulong)pp->view_size);
                hash_update_x4_4((hash_context_x4 *)local_700,
                                 *(uint8_t **)((long)prf + lVar50 + 0x30 + lVar29),
                                 *(uint8_t **)((long)prf + lVar50 + 0x30 + lVar16),
                                 *(uint8_t **)((long)prf + lVar50 + 0x30 + lVar18),
                                 *(uint8_t **)((long)prf + lVar50 + 0x30 + lVar17),
                                 (ulong)pp->input_output_size);
                hash_final_x4((hash_context_x4 *)local_700);
                hash_squeeze_x4_4((hash_context_x4 *)local_700,
                                  *(uint8_t **)((long)prf + lVar50 + -0x18 + lVar29),
                                  *(uint8_t **)((long)prf + lVar50 + -0x18 + lVar16),
                                  *(uint8_t **)((long)prf + lVar50 + -0x18 + lVar18),
                                  *(uint8_t **)((long)prf + lVar50 + -0x18 + lVar17),uVar33);
              }
              if (context->unruh == true) {
                for (lVar50 = 0; lVar50 != 0x10; lVar50 = lVar50 + 8) {
                  bVar53 = uVar28 == 1 && lVar50 == 8 || lVar50 == 0 && uVar28 == 2;
                  uVar33 = (ulong)pp->digest_size;
                  uVar10 = *(ushort *)((long)local_990 + 4);
                  uVar25 = *local_990;
                  uVar11 = *(ushort *)((long)local_990 + 2);
                  uVar12 = *(ushort *)((long)local_990 + 6);
                  hash_init_prefix_x4((hash_context_x4 *)local_700,uVar33,'\x05');
                  lVar29 = (ulong)(ushort)uVar25 * 0x90 + 0xa0;
                  lVar16 = (ulong)uVar12 * 0x90 + 0xa0;
                  lVar17 = (ulong)uVar11 * 0x90 + 0xa0;
                  lVar18 = (ulong)uVar10 * 0x90 + 0xa0;
                  hash_update_x4_4((hash_context_x4 *)local_700,
                                   *(uint8_t **)((long)prf + lVar50 + -0x78 + lVar29),
                                   *(uint8_t **)((long)prf + lVar50 + -0x78 + lVar17),
                                   *(uint8_t **)((long)prf + lVar50 + -0x78 + lVar18),
                                   *(uint8_t **)((long)prf + lVar50 + -0x78 + lVar16),
                                   (ulong)pp->seed_size);
                  hash_final_x4((hash_context_x4 *)local_700);
                  hash_squeeze_x4_4((hash_context_x4 *)local_700,(uint8_t *)&local_840,
                                    local_840.sponge.state + 0x40,buffer2,buffer3,uVar33);
                  hash_init_x4((hash_context_x4 *)local_700,uVar33);
                  hash_update_x4_4((hash_context_x4 *)local_700,(uint8_t *)&local_840,
                                   local_840.sponge.state + 0x40,buffer2,buffer3,uVar33);
                  if (bVar53) {
                    hash_update_x4_4((hash_context_x4 *)local_700,
                                     *(uint8_t **)((long)prf + lVar50 + -0x48 + lVar29),
                                     *(uint8_t **)((long)prf + lVar50 + -0x48 + lVar17),
                                     *(uint8_t **)((long)prf + lVar50 + -0x48 + lVar18),
                                     *(uint8_t **)((long)prf + lVar50 + -0x48 + lVar16),
                                     (ulong)pp->input_output_size);
                  }
                  hash_update_x4_4((hash_context_x4 *)local_700,
                                   *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar29),
                                   *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar17),
                                   *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar18),
                                   *(uint8_t **)((long)prf + lVar50 + -0x30 + lVar16),
                                   (ulong)pp->view_size);
                  uVar27 = 0;
                  if (bVar53) {
                    uVar27 = (uint)pp->input_output_size;
                  }
                  uVar27 = (uint)pp->view_size + (uint)pp->input_output_size + uVar27;
                  hash_update_x4_uint16_le((hash_context_x4 *)local_700,(uint16_t)uVar27);
                  hash_final_x4((hash_context_x4 *)local_700);
                  hash_squeeze_x4_4((hash_context_x4 *)local_700,
                                    *(uint8_t **)((long)prf + lVar50 + lVar29),
                                    *(uint8_t **)((long)prf + lVar50 + lVar17),
                                    *(uint8_t **)((long)prf + lVar50 + lVar18),
                                    *(uint8_t **)((long)prf + lVar50 + lVar16),(ulong)uVar27);
                }
              }
              local_990 = local_990 + 1;
              uVar45 = uVar45 + 4;
            }
            for (; uVar27 = uVar28 + 1, uVar45 < local_94c; uVar45 = uVar45 + 1) {
              prf_round = (proof_round_t *)((ulong)(ushort)*local_990 * 0x90 + (long)local_968);
              ppVar42 = prf_round;
              for (lVar50 = 0; lVar50 != 0x1c0; lVar50 = lVar50 + 0xe0) {
                uVar37 = (uint16_t)uVar38;
                if (lVar50 == 0) {
                  uVar37 = (uint16_t)uVar28;
                }
                kdf_init_from_seed((kdf_shake_t *)(local_700 + lVar50),ppVar42->seeds[0],
                                   (uint8_t *)prf,(uint16_t)*local_990,uVar37,
                                   lVar50 == 0 && uVar38 != 0 || lVar50 == 0xe0 && uVar39 != 0,pp);
                ppVar42 = (proof_round_t *)(ppVar42->seeds + 1);
              }
              if (uVar38 != 0) {
                hash_squeeze((hash_context *)local_700,prf_round->input_shares[0],uVar31);
                prf_round->input_shares[0][uVar51] = prf_round->input_shares[0][uVar51] & bVar36;
              }
              if (uVar39 != 0) {
                hash_squeeze((hash_context *)(local_640 + 0x20),prf_round->input_shares[1],uVar31);
                prf_round->input_shares[1][uVar51] = prf_round->input_shares[1][uVar51] & bVar36;
              }
              mzd_from_char_array(&local_8a0,prf_round->input_shares[0],uVar31);
              mzd_from_char_array(&local_880,prf_round->input_shares[1],uVar31);
              ctx = (hash_context *)local_700;
              for (lVar50 = 0; lVar50 != 2; lVar50 = lVar50 + 1) {
                hash_squeeze(ctx,(uint8_t *)&local_840,uVar35);
                decompress_view(views_00,pp,(uint8_t *)&local_840,(uint)lVar50);
                ctx = ctx + 1;
              }
              decompress_view(views,pp,prf_round->communicated_bits[1],1);
              pamVar52 = (mzd_local_t (*) [1])&local_8a0;
              (*p_Var24)(context->m_plaintext,views,(in_out_shares_t *)pamVar52,views_00,uVar28);
              compress_view(prf_round->communicated_bits[0],pp,views,0);
              mzd_share(&pp->lowmc,&local_860,(mzd_local_t *)pamVar52,&local_880,context->m_key);
              for (lVar50 = 0; lVar50 != 2; lVar50 = lVar50 + 1) {
                mzd_to_char_array(prf_round->output_shares[lVar50],*pamVar52,uVar31);
                hash_commitment(pp,prf_round,(uint)lVar50);
                pamVar52 = pamVar52 + 1;
              }
              mzd_to_char_array(prf_round->output_shares[2],&local_860,uVar31);
              if (context->unruh == true) {
                for (uVar27 = 0; uVar27 != 2; uVar27 = uVar27 + 1) {
                  unruh_G(pp,prf_round,uVar27,
                          uVar27 == 1 && uVar28 == 1 || uVar28 == 2 && uVar27 == 0);
                }
              }
              local_990 = (ulong *)((long)local_990 + 2);
            }
          }
          local_700._0_64_ = ZEXT1664(ZEXT816(0) << 0x40);
          auStack_580 = ZEXT654(0);
          auStack_5c0 = ZEXT1654(ZEXT816(0) << 0x40);
          local_58a[0] = '\0';
          local_58a[1] = '\0';
          local_58a[2] = '\0';
          local_58a[3] = '\0';
          local_58a[4] = '\0';
          local_58a[5] = '\0';
          local_58a[6] = '\0';
          local_58a[7] = '\0';
          local_58a[8] = '\0';
          local_58a[9] = '\0';
          uVar21 = (ulong)pp->num_rounds;
          bVar1 = pp->input_output_size;
          uVar31 = (ulong)bVar1;
          uVar51 = (ulong)pp->digest_size;
          local_700._64_64_ = local_700._0_64_;
          local_680 = local_700._0_64_;
          local_640 = local_700._0_64_;
          local_600 = local_700._0_64_;
          hash_init_prefix(&local_840,uVar51,'\x01');
          ppuVar49 = &prf[3].challenge;
          psVar30 = local_968;
          for (uVar35 = 0; uVar21 != uVar35; uVar35 = uVar35 + 1) {
            if (prf->challenge[uVar35] == '\x01') {
              hash_update(&local_840,*ppuVar49,uVar31);
              hash_update(&local_840,ppuVar49[-2],uVar31);
              ppuVar43 = (uint8_t **)(psVar30[2].salt + 0x18);
            }
            else if (prf->challenge[uVar35] == '\0') {
              hash_update(&local_840,ppuVar49[-2],uVar31);
              hash_update(&local_840,ppuVar49[-1],uVar31);
              ppuVar43 = ppuVar49;
            }
            else {
              ppuVar43 = (uint8_t **)(psVar30[2].salt + 0x10);
              hash_update(&local_840,ppuVar49[-1],uVar31);
              hash_update(&local_840,*ppuVar49,uVar31);
            }
            hash_update(&local_840,*ppuVar43,uVar31);
            psVar30 = (sig_proof_t *)(psVar30[3].salt + 0x18);
            ppuVar49 = ppuVar49 + 0x12;
          }
          psVar30 = prf + 2;
          psVar47 = local_968;
          for (uVar35 = 0; uVar21 != uVar35; uVar35 = uVar35 + 1) {
            if (prf->challenge[uVar35] == '\x01') {
              hash_update(&local_840,*(uint8_t **)psVar30->salt,uVar51);
              hash_update(&local_840,*(uint8_t **)(psVar30[-1].salt + 0x18),uVar51);
              psVar44 = (sig_proof_t *)&psVar47->challenge;
            }
            else if (prf->challenge[uVar35] == '\0') {
              hash_update(&local_840,*(uint8_t **)(psVar30[-1].salt + 0x18),uVar51);
              hash_update(&local_840,psVar30[-1].challenge,uVar51);
              psVar44 = psVar30;
            }
            else {
              psVar44 = (sig_proof_t *)(psVar47->salt + 0x18);
              hash_update(&local_840,psVar30[-1].challenge,uVar51);
              hash_update(&local_840,*(uint8_t **)psVar30->salt,uVar51);
            }
            hash_update(&local_840,*(uint8_t **)psVar44->salt,uVar51);
            psVar47 = (sig_proof_t *)(psVar47[3].salt + 0x18);
            psVar30 = (sig_proof_t *)(psVar30[3].salt + 0x18);
          }
          if (context->unruh != false) {
            psVar30 = (sig_proof_t *)(prf[4].salt + 0x10);
            uVar27 = (uint)pp->view_size + (uint)bVar1;
            uVar35 = (ulong)uVar27;
            for (uVar31 = 0; uVar21 != uVar31; uVar31 = uVar31 + 1) {
              if (prf->challenge[uVar31] == '\x01') {
                hash_update(&local_840,*(uint8_t **)psVar30->salt,uVar35);
                hash_update(&local_840,*(uint8_t **)(psVar30[-1].salt + 0x18),uVar35);
                psVar47 = (sig_proof_t *)(local_968[3].salt + 8);
              }
              else if (prf->challenge[uVar31] == '\0') {
                hash_update(&local_840,*(uint8_t **)(psVar30[-1].salt + 0x18),uVar35);
                hash_update(&local_840,psVar30[-1].challenge,uVar35);
                psVar47 = psVar30;
              }
              else {
                psVar47 = local_968 + 3;
                hash_update(&local_840,psVar30[-1].challenge,uVar35);
                hash_update(&local_840,*(uint8_t **)psVar30->salt,uVar35);
              }
              hash_update(&local_840,*(uint8_t **)psVar47->salt,(ulong)(bVar1 + uVar27));
              local_968 = (sig_proof_t *)(local_968[3].salt + 0x18);
              psVar30 = (sig_proof_t *)(psVar30[3].salt + 0x18);
            }
          }
          H3_public_key_message(&local_840,pp,(uint8_t *)prf,context);
          hash_final(&local_840);
          local_740[0] = 0;
          local_740[1] = 0;
          local_740[2] = 0;
          local_740[3] = 0;
          local_740[4] = 0;
          local_740[5] = 0;
          local_740[6] = 0;
          local_740[7] = 0;
          hash_squeeze(&local_840,(uint8_t *)local_740,uVar51);
          H3_compute(pp,(uint8_t *)local_740,local_700);
          iVar20 = memcmp(local_700,prf->challenge,(ulong)pp->num_rounds);
          free(puVar22);
          free(__ptr);
          free(views_00);
          free(views);
          proof_free(prf);
          return iVar20;
        }
      }
    }
LAB_0011580e:
    proof_free(prf);
  }
  return -1;
}

Assistant:

int picnic_impl_verify(const picnic_instance_t* pp, const picnic_context_t* context,
                       const uint8_t* sig, size_t siglen) {
  sig_proof_t* prf = sig_proof_from_char_array(pp, context, sig, siglen);
  if (!prf) {
    return -1;
  }

  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_verify_implementation_f lowmc_verify_impl =
      get_zkbpp_lowmc_verify_implementation(&pp->lowmc);

  in_out_shares_t in_out_shares;
  view_t* views = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);
  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for and-gates

  // sort the different challenge rounds based on their H3 index, so we can use the 4x Keccak when
  // verifying since all of this is public information, there is no leakage
  sorting_helper_t* sorted_rounds = malloc(sizeof(sorting_helper_t) * num_rounds);

  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_VERIFY * 4 * aview_size);
  for (unsigned int current_chal = 0; current_chal < 3; current_chal++) {
    unsigned int num_current_rounds = 0;
    for (unsigned int r = 0; r < num_rounds; r++) {
      if (prf->challenge[r] == current_chal) {
        sorted_rounds[num_current_rounds++] = r;
      }
    }
    unsigned int i                 = 0;
    const sorting_helper_t* helper = sorted_rounds;
    for (; i < (num_current_rounds / 4) * 4; i += 4, helper += 4) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      const proof_round_t* prf0 = &prf->round[helper[0]];
      const proof_round_t* prf1 = &prf->round[helper[1]];
      const proof_round_t* prf2 = &prf->round[helper[2]];
      const proof_round_t* prf3 = &prf->round[helper[3]];

      {
        kdf_shake_x4_t kdfs[SC_VERIFY];
        const uint16_t round_numbers[4] = {helper[0], helper[1], helper[2], helper[3]};
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          const uint8_t* seeds[4]          = {prf0->seeds[j], prf1->seeds[j], prf2->seeds[j],
                                              prf3->seeds[j]};
          kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, player_number,
                                include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[0], prf0->input_shares[0], prf1->input_shares[0],
                                        prf2->input_shares[0], prf3->input_shares[0],
                                        input_output_size);
        }
        if (c_i) {
          kdf_shake_x4_get_randomness_4(&kdfs[1], prf0->input_shares[1], prf1->input_shares[1],
                                        prf2->input_shares[1], prf3->input_shares[1],
                                        input_output_size);
        }
        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                        &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
          kdf_shake_x4_clear(&kdfs[j]);
        }
      }

      for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
        proof_round_t* round = &prf->round[helper[round_offset]];

        if (b_i) {
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        if (c_i) {
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
        }

        decompress_view(views, pp, round->communicated_bits[1], 1);
        // perform ZKB++ LowMC evaluation
        lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
        compress_view(round->communicated_bits[0], pp, views, 0);

        mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                  context->m_key);
        // recompute commitments
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        }
        mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                          input_output_size);
      }
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        hash_commitment_x4_verify(pp, prf->round, helper, j);
      }
#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G_x4_verify(pp, prf->round, helper, j,
                            (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
    for (; i < num_current_rounds; ++i, ++helper) {
      const unsigned int a_i = current_chal;
      const unsigned int b_i = (a_i + 1) % 3;
      const unsigned int c_i = (a_i + 2) % 3;

      proof_round_t* round = &prf->round[*helper];
      {
        kdf_shake_t kdfs[SC_VERIFY];
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          const bool include_input_size    = (j == 0 && b_i) || (j == 1 && c_i);
          const unsigned int player_number = (j == 0) ? a_i : b_i;
          kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, *helper, player_number,
                             include_input_size, pp);
        }

        // compute input shares if necessary
        if (b_i) {
          kdf_shake_get_randomness(&kdfs[0], round->input_shares[0], input_output_size);
          clear_padding_bits(&round->input_shares[0][input_output_size - 1], diff);
        }
        if (c_i) {
          kdf_shake_get_randomness(&kdfs[1], round->input_shares[1], input_output_size);
          clear_padding_bits(&round->input_shares[1][input_output_size - 1], diff);
        }

        mzd_from_char_array(in_out_shares.s[0], round->input_shares[0], input_output_size);
        mzd_from_char_array(in_out_shares.s[1], round->input_shares[1], input_output_size);

        // compute random tapes
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          assert(view_size <= MAX_VIEW_SIZE);
          uint8_t tape_bytes[MAX_VIEW_SIZE];
          kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
          decompress_random_tape(rvec, pp, tape_bytes, j);
        }

        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          kdf_shake_clear(&kdfs[j]);
        }
      }

      decompress_view(views, pp, round->communicated_bits[1], 1);
      // perform ZKB++ LowMC evaluation
      lowmc_verify_impl(context->m_plaintext, views, &in_out_shares, rvec, a_i);
      compress_view(round->communicated_bits[0], pp, views, 0);

      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      // recompute commitments
      for (unsigned int j = 0; j < SC_VERIFY; ++j) {
        mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
        hash_commitment(pp, round, j);
      }
      mzd_to_char_array(round->output_shares[SC_VERIFY], in_out_shares.s[SC_VERIFY],
                        input_output_size);

#if defined(WITH_UNRUH)
      if (context->unruh) {
        // apply Unruh G permutation
        for (unsigned int j = 0; j < SC_VERIFY; ++j) {
          unruh_G(pp, round, j, (a_i == 1 && j == 1) || (a_i == 2 && j == 0));
        }
      }
#endif
    }
  }

  assert(pp->num_rounds <= MAX_NUM_ROUNDS);
  unsigned char challenge[MAX_NUM_ROUNDS] = {0};
  H3_verify(pp, prf, context, challenge);
  const int success_status = memcmp(challenge, prf->challenge, pp->num_rounds);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  free(sorted_rounds);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);

  proof_free(prf);

  return success_status;
}